

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::showFullScreen(QWidget *this)

{
  QFlagsStorage<Qt::WindowState> QVar1;
  QFlags<Qt::WindowState> other;
  QFlagsStorage<Qt::WindowState> QVar2;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QFlagsStorage<Qt::WindowState> in_stack_00000014;
  WindowState other_00;
  QWidget *this_00;
  
  this_00 = *(QWidget **)(in_FS_OFFSET + 0x28);
  ensurePolished(this_00);
  QVar1.i = (Int)windowState(in_RDI);
  other_00 = WindowMinimized;
  Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  other = QFlags<Qt::WindowState>::operator~((QFlags<Qt::WindowState> *)in_RDI);
  QVar2.i = (Int)QFlags<Qt::WindowState>::operator&((QFlags<Qt::WindowState> *)in_RDI,other);
  QFlags<Qt::WindowState>::operator|((QFlags<Qt::WindowState> *)in_RDI,other_00);
  setWindowState((QWidget *)CONCAT44(QVar2.i,QVar1.i),(WindowStates)in_stack_00000014.i);
  (**(code **)(*(long *)in_RDI + 0x68))(in_RDI,other_00);
  activateWindow(in_RDI);
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::showFullScreen()
{
    ensurePolished();

    setWindowState((windowState() & ~(Qt::WindowMinimized | Qt::WindowMaximized))
                   | Qt::WindowFullScreen);
    setVisible(true);
#if !defined Q_OS_QNX // On QNX this window will be activated anyway from libscreen
                      // activating it here before libscreen activates it causes problems
    activateWindow();
#endif
}